

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O2

void __thiscall Scs::Server::RunConnection(Server *this,ClientConnectionPtr *connection)

{
  mutex *__mutex;
  element_type *peVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  size_t __new_size;
  lock_guard<std::mutex> lock;
  BufferPtr receivedData;
  BufferPtr receiveBuffer;
  undefined1 local_78 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  lVar5 = this->m_timeoutMs;
  CreateBuffer();
  std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_78._24_8_,0x20000);
  lVar4 = lVar5 * 1000000 + lVar4;
  __mutex = &this->m_notifierMutex;
  while( true ) {
    if ((((connection->super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr)->connected != true) || (((this->m_shutDown)._M_base._M_i & 1U) != 0))
    goto LAB_0010ee89;
    local_78._0_8_ = (undefined8 *)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)local_78);
    lVar5 = std::chrono::_V2::system_clock::now();
    peVar1 = (connection->
             super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (lVar4 <= lVar5) break;
    bVar3 = Socket::IsWritable((peVar1->socket).
                               super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar3) {
      bVar3 = SendQueue::Empty(&((connection->
                                 super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->sendQueue);
      if (!bVar3) {
        peVar1 = (connection->
                 super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        std::__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x28),
                   &(peVar1->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>);
        bVar3 = SendQueue::Send(&peVar1->sendQueue,(SocketPtr *)(local_78 + 0x28));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        if (!bVar3) {
          LogWriteLine("Error sending data to client.  Shutting down connection.");
          goto LAB_0010ee82;
        }
        local_78._0_8_ = &DAT_0000000a;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)local_78);
        lVar4 = std::chrono::_V2::system_clock::now();
        lVar4 = this->m_timeoutMs * 1000000 + lVar4;
      }
    }
    bVar3 = Socket::IsReadable((((connection->
                                 super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->socket).
                               super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar3) {
      std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_78._24_8_,
                 *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                            local_78._24_8_)->_M_impl).field_0x10 -
                 *(long *)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                           local_78._24_8_)->_M_impl);
      pvVar2 = *(void **)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                          local_78._24_8_)->_M_impl;
      __new_size = Socket::Receive((((connection->
                                     super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->socket).
                                   super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,pvVar2,
                                   *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                                *)local_78._24_8_)->_M_impl).field_0x8 -
                                   (long)pvVar2,0);
      if (__new_size != 0) {
        std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_78._24_8_,
                   __new_size);
        pvVar2 = *(void **)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                            local_78._24_8_)->_M_impl;
        ReceiveQueue::Push(&((connection->
                             super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->receiveQueue,pvVar2,
                           *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                        *)local_78._24_8_)->_M_impl).field_0x8 - (long)pvVar2);
        lVar5 = *(long *)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                          local_78._24_8_)->_M_impl;
        if (*(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                       local_78._24_8_)->_M_impl).field_0x8 != lVar5) {
          *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_78._24_8_
                     )->_M_impl).field_0x8 = lVar5;
        }
        ReceiveQueue::Pop((ReceiveQueue *)local_78);
        while ((undefined8 *)local_78._0_8_ != (undefined8 *)0x0) {
          if ((this->m_onReceiveData).super__Function_base._M_manager != (_Manager_type)0x0) {
            std::mutex::lock(__mutex);
            std::function<void_(Scs::IServer_&,_int,_const_void_*,_unsigned_long)>::operator()
                      (&this->m_onReceiveData,&this->super_IServer,
                       ((connection->
                        super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->clientID,*(void **)local_78._0_8_,
                       *(long *)(local_78._0_8_ + 8) - (long)*(void **)local_78._0_8_);
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
          ReceiveQueue::Pop((ReceiveQueue *)&stack0xffffffffffffffc0);
          std::
          __shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=((__shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)local_78,
                      (__shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)&stack0xffffffffffffffc0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
        }
        lVar4 = std::chrono::_V2::system_clock::now();
        lVar4 = this->m_timeoutMs * 1000000 + lVar4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      }
    }
  }
  LogWriteLine("Client %d timed out. Closing connection.",(ulong)(uint)peVar1->clientID);
LAB_0010ee82:
  ((connection->super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr)->connected = false;
LAB_0010ee89:
  if ((this->m_onDisconnect).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::mutex::lock(__mutex);
    std::function<void_(Scs::IServer_&,_int)>::operator()
              (&this->m_onDisconnect,&this->super_IServer,
               ((connection->
                super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->clientID);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  local_78._0_8_ = 0;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((connection->
                super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  LogWriteLine("Closing client %d connection thread.",
               (ulong)(uint)((connection->
                             super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->clientID);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x20));
  return;
}

Assistant:

void Server::RunConnection(ClientConnectionPtr connection)
{
	// Set timeout point
	auto timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);

	// Create a receive buffer
	BufferPtr receiveBuffer = CreateBuffer();
	receiveBuffer->reserve(RECEIVE_BUFFER_SIZE);

	// Each client connection runs in a separate thread, controlled
	// by this function.
	while (connection->connected && !m_shutDown)
	{
		// Don't burn too much CPU while idling
		std::this_thread::sleep_for(std::chrono::microseconds(1));

		// Check for connection timeout.  We don't want to keep this connection thread
		// alive if we're not actively sending or receiving data to the client.
		if (std::chrono::system_clock::now() >= timeoutTime)
		{
			LogWriteLine("Client %d timed out. Closing connection.", connection->clientID);
			connection->connected = false;
			break;
		}

		// Check first to see if we can write to the socket
		if (connection->socket->IsWritable())
		{
			if (!connection->sendQueue.Empty())
			{
				if (!connection->sendQueue.Send(connection->socket))
				{
					LogWriteLine("Error sending data to client.  Shutting down connection.");
					connection->connected = false;
					break;
				}

				// We need to throttle our connection transmission rate
				std::this_thread::sleep_for(std::chrono::milliseconds(SEND_THROTTLE_MS));

				// Reset timeout
				timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);
			}
		}

		// Check for incoming data
		if (connection->socket->IsReadable())
		{
			// Read data from socket
			receiveBuffer->resize(receiveBuffer->capacity());
			size_t bytesReceived = connection->socket->Receive(receiveBuffer->data(), receiveBuffer->size(), 0);
			if (bytesReceived)
			{
				// Push data into the receive queue
				receiveBuffer->resize(bytesReceived);
				connection->receiveQueue.Push(receiveBuffer->data(), receiveBuffer->size());
				receiveBuffer->clear();

				// Process data in receive queue
				BufferPtr receivedData = connection->receiveQueue.Pop();
				while (receivedData)
				{
					if (m_onReceiveData)
					{
						std::lock_guard<std::mutex> lock(m_notifierMutex);
						m_onReceiveData(*this, connection->clientID, receivedData->data(), receivedData->size());
					}
					receivedData = connection->receiveQueue.Pop();
				}		

				// Reset timeout
				timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);
			}
		}
	}

	// We're shutting down, so make sure all sockets are disconnected
	// and the connection data structure is removed from the connection
	// list and deleted.
	if (m_onDisconnect)
	{
		std::lock_guard<std::mutex> lock(m_notifierMutex);
		m_onDisconnect(*this, connection->clientID);
	}
	connection->socket = nullptr;
	LogWriteLine("Closing client %d connection thread.", connection->clientID);
}